

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PcacheRelease(PgHdr *p)

{
  PCache *pCache;
  PgHdr *p_local;
  
  p->nRef = p->nRef + -1;
  if (p->nRef == 0) {
    p->pCache->nRef = p->pCache->nRef + -1;
    if ((p->flags & 2) == 0) {
      pcacheUnpin(p);
    }
    else {
      pcacheRemoveFromDirtyList(p);
      pcacheAddToDirtyList(p);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheRelease(PgHdr *p){
  assert( p->nRef>0 );
  p->nRef--;
  if( p->nRef==0 ){
    PCache *pCache = p->pCache;
    pCache->nRef--;
    if( (p->flags&PGHDR_DIRTY)==0 ){
      pcacheUnpin(p);
    }else{
      /* Move the page to the head of the dirty list. */
      pcacheRemoveFromDirtyList(p);
      pcacheAddToDirtyList(p);
    }
  }
}